

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManPrintQuit(Lf_Man_t *p,Gia_Man_t *pNew)

{
  Gia_Man_t *pGVar1;
  Vec_Mem_t *pVVar2;
  long lVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  timespec ts;
  timespec local_28;
  
  dVar12 = Gia_ManMemory(p->pGia);
  pGVar1 = p->pGia;
  pVVar2 = p->vTtMem;
  iVar9 = pGVar1->nObjs;
  fVar15 = 0.0;
  fVar14 = 0.0;
  if (pVVar2 != (Vec_Mem_t *)0x0) {
    fVar14 = ((float)pVVar2->nPageAlloc * 8.0 +
              (float)(pVVar2->iPage + 1) *
              (float)(1 << ((byte)pVVar2->LogPageSze & 0x1f)) * (float)pVVar2->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    fVar15 = ((float)pNew->vMapping->nCap * 4.0 + 16.0) * 9.536743e-07;
  }
  dVar13 = p->CutCount[0];
  iVar8 = (~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + iVar9) - pGVar1->nBufs;
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    p->CutCount[0] = 1.0;
    dVar13 = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar6 = (float)iVar8 * 32.0 * 9.536743e-07 +
            (float)((p->vStoreOld).vPages.nSize + (p->vFreePages).nSize) *
            (float)((p->vStoreOld).MaskPage + 1) * 9.536743e-07;
    fVar5 = (float)(iVar8 * 3 + iVar9 * 2) * 4.0 * 9.536743e-07;
    fVar7 = (float)(p->vMemSets).nSize * (float)p->nSetWords * 8.0 * 4096.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",dVar13);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar12 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar5);
    printf("Best = %.2f MB  ",(double)fVar6);
    printf("Front = %.2f MB   ",(double)fVar7);
    printf("Map = %.2f MB  ",(double)fVar15);
    printf("TT = %.2f MB  ",(double)fVar14);
    printf("Total = %.2f MB",
           (double)((float)(dVar12 * 9.5367431640625e-07) + fVar5 + fVar6 + fVar7 + fVar15 + fVar14)
          );
    putchar(10);
    if (-1 < p->pPars->nLutSize) {
      uVar11 = 0;
      do {
        printf("%d:%d  ",uVar11 & 0xffffffff,(ulong)(uint)p->nCutCounts[uVar11]);
        bVar4 = (long)uVar11 < (long)p->pPars->nLutSize;
        uVar11 = uVar11 + 1;
      } while (bVar4);
    }
    pGVar1 = p->pGia;
    printf("Equal = %d (%.0f %%) ",
           (((double)p->nCutEqual * 100.0) / (double)p->Iter) /
           (double)((~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs) - pGVar1->nBufs))
    ;
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      printf("TT = %d (%.2f %%)  ",((double)p->vTtMem->nEntries * 100.0) / p->CutCount[2]);
    }
    if (p->pGia->pMuxes != (uint *)0x0) {
      if (p->nCutMux != 0) {
        printf("MuxTT = %d (%.0f %%) ",
               (((double)p->nCutMux * 100.0) / (double)p->Iter) / (double)p->pGia->nMuxes);
      }
    }
    putchar(10);
    printf("CoDrvs = %d (%.2f %%)  ",((double)p->nCoDrivers * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    printf("CoInvs = %d (%.2f %%)  ",((double)p->nInverters * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    pGVar1 = p->pGia;
    printf("Front = %d (%.2f %%)  ",
           ((double)p->nFrontMax * 100.0) /
           (double)(~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs));
    printf("TimeFails = %d   ",(ulong)(uint)p->nTimeFails);
    iVar9 = clock_gettime(3,&local_28);
    if (iVar9 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar3 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar10 - lVar3) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Lf_ManPrintQuit( Lf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(int) * (2 * Gia_ManObjNum(p->pGia) + 3 * Gia_ManAndNotBufNum(p->pGia)) / (1<<20); // offset, required, cutsets, maprefs, flowrefs
    float MemCutsB = 1.0 * (p->vStoreOld.MaskPage + 1) * (Vec_PtrSize(&p->vFreePages) + Vec_PtrSize(&p->vStoreOld.vPages)) / (1<<20) + 1.0 * sizeof(Lf_Bst_t) * Gia_ManAndNotBufNum(p->pGia) / (1<<20);
    float MemCutsF = 1.0 * sizeof(word) * p->nSetWords * (1<<LF_LOG_PAGE) * Vec_PtrSize(&p->vMemSets) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Best = %.2f MB  ",         MemCutsB );
    printf( "Front = %.2f MB   ",       MemCutsF );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCutsB + MemCutsF + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d:%d  ", i, p->nCutCounts[i] );
        printf( "Equal = %d (%.0f %%) ", p->nCutEqual, 100.0 * p->nCutEqual / p->Iter / Gia_ManAndNotBufNum(p->pGia) );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        if ( p->pGia->pMuxes && p->nCutMux )
            printf( "MuxTT = %d (%.0f %%) ", p->nCutMux, 100.0 * p->nCutMux / p->Iter / Gia_ManMuxNum(p->pGia) );
        printf( "\n" );
    }
    printf( "CoDrvs = %d (%.2f %%)  ",  p->nCoDrivers, 100.0*p->nCoDrivers/Gia_ManCoNum(p->pGia) );
    printf( "CoInvs = %d (%.2f %%)  ",  p->nInverters, 100.0*p->nInverters/Gia_ManCoNum(p->pGia) );
    printf( "Front = %d (%.2f %%)  ",   p->nFrontMax,  100.0*p->nFrontMax/Gia_ManAndNum(p->pGia) );
    printf( "TimeFails = %d   ",        p->nTimeFails );
    Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    fflush( stdout );
}